

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_trace_scan_avx2_256_64.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_trace_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  undefined1 (*pauVar2) [24];
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  ulong uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  __m256i alVar11;
  __m256i alVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  uint uVar16;
  uint uVar17;
  int iVar18;
  parasail_result_t *ppVar19;
  __m256i *ptr;
  int64_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  int iVar20;
  int iVar21;
  ulong uVar22;
  __m256i *palVar23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  __m256i *palVar27;
  ulong uVar28;
  uint a;
  long lVar29;
  bool bVar30;
  uint uVar31;
  long lVar32;
  long lVar33;
  undefined8 uVar34;
  ulong uVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar58 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  
  auVar38 = in_ZMM11._0_16_;
  auVar57 = in_ZMM10._0_32_;
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_trace_scan_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sg_flags_trace_scan_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_trace_scan_profile_avx2_256_64_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sg_flags_trace_scan_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_trace_scan_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_trace_scan_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_trace_scan_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_trace_scan_profile_avx2_256_64_cold_1();
        }
        else {
          uVar17 = uVar3 - 1;
          uVar35 = (ulong)uVar3 + 3 >> 2;
          uVar7 = (ulong)uVar17 % uVar35;
          iVar18 = (int)(uVar17 / uVar35);
          iVar20 = -open;
          iVar21 = ppVar5->min;
          uVar25 = 0x8000000000000000 - (long)iVar21;
          if (iVar21 != iVar20 && SBORROW4(iVar21,iVar20) == iVar21 + open < 0) {
            uVar25 = CONCAT44(0,open) | 0x8000000000000000;
          }
          iVar21 = ppVar5->max;
          a = (uint)uVar35;
          ppVar19 = parasail_result_new_trace(a,s2Len,0x20,0x20);
          if (ppVar19 != (parasail_result_t *)0x0) {
            ppVar19->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar19->flag | 0x4880402;
            ptr = parasail_memalign___m256i(0x20,uVar35);
            ptr_00 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m256i(0x20,uVar35);
            ptr_02 = parasail_memalign___m256i(0x20,uVar35);
            ptr_03 = parasail_memalign___m256i(0x20,uVar35);
            if (ptr_03 != (__m256i *)0x0 &&
                ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                (ptr_00 != (int64_t *)0x0 && ptr != (__m256i *)0x0))) {
              iVar1 = s2Len + -1;
              iVar26 = -iVar18 + 3;
              auVar47._8_4_ = open;
              auVar47._0_8_ = CONCAT44(0,open);
              auVar47._12_4_ = 0;
              auVar47._16_4_ = open;
              auVar47._20_4_ = 0;
              auVar47._24_4_ = open;
              auVar47._28_4_ = 0;
              auVar48._8_4_ = gap;
              auVar48._0_8_ = CONCAT44(0,gap);
              auVar48._12_4_ = 0;
              auVar48._16_4_ = gap;
              auVar48._20_4_ = 0;
              auVar48._24_4_ = gap;
              auVar48._28_4_ = 0;
              uVar25 = uVar25 + 1;
              lVar29 = 0x7ffffffffffffffe - (long)iVar21;
              auVar51._8_8_ = lVar29;
              auVar51._0_8_ = lVar29;
              auVar51._16_8_ = lVar29;
              auVar51._24_8_ = lVar29;
              lVar29 = (long)(int)-(a * gap);
              auVar39._8_8_ = lVar29;
              auVar39._0_8_ = lVar29;
              auVar39._16_8_ = lVar29;
              auVar39._24_8_ = lVar29;
              auVar39 = vpblendd_avx2(auVar39,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
              auVar39 = vpaddq_avx2(ZEXT832(uVar25),auVar39);
              bVar36 = s1_beg != 0;
              lVar29 = (long)iVar20;
              auVar41._4_4_ = a;
              auVar41._0_4_ = a;
              auVar41._8_4_ = a;
              auVar41._12_4_ = a;
              auVar41._16_4_ = a;
              auVar41._20_4_ = a;
              auVar41._24_4_ = a;
              auVar41._28_4_ = a;
              auVar40._8_4_ = gap;
              auVar40._0_8_ = CONCAT44(0,gap);
              auVar40._12_4_ = 0;
              auVar40._16_4_ = gap;
              auVar40._20_4_ = 0;
              auVar40._24_4_ = gap;
              auVar40._28_4_ = 0;
              auVar45._8_8_ = lVar29;
              auVar45._0_8_ = lVar29;
              auVar45._16_8_ = lVar29;
              auVar45._24_8_ = lVar29;
              auVar54 = vpmuldq_avx2(auVar41,_DAT_00908b60);
              auVar49[1] = bVar36;
              auVar49[0] = bVar36;
              auVar49[2] = bVar36;
              auVar49[3] = bVar36;
              auVar49[4] = bVar36;
              auVar49[5] = bVar36;
              auVar49[6] = bVar36;
              auVar49[7] = bVar36;
              auVar49[8] = bVar36;
              auVar49[9] = bVar36;
              auVar49[10] = bVar36;
              auVar49[0xb] = bVar36;
              auVar49[0xc] = bVar36;
              auVar49[0xd] = bVar36;
              auVar49[0xe] = bVar36;
              auVar49[0xf] = bVar36;
              uVar22 = 0;
              auVar49 = vpslld_avx(auVar49,0x1f);
              auVar49 = vpsrad_avx(auVar49,0x1f);
              auVar41 = vpmovsxdq_avx2(auVar49);
              palVar23 = ptr_02;
              palVar27 = ptr;
              do {
                auVar53._8_8_ = uVar22;
                auVar53._0_8_ = uVar22;
                auVar53._16_8_ = uVar22;
                auVar53._24_8_ = uVar22;
                auVar53 = vpaddq_avx2(auVar53,auVar54);
                auVar55 = vpmuludq_avx2(auVar53,auVar40);
                auVar53 = vpsrlq_avx2(auVar53,0x20);
                auVar53 = vpmuludq_avx2(auVar53,auVar40);
                auVar53 = vpsllq_avx2(auVar53,0x20);
                auVar53 = vpaddq_avx2(auVar55,auVar53);
                auVar53 = vpsubq_avx2(auVar45,auVar53);
                alVar11 = (__m256i)vpandn_avx2(auVar41,auVar53);
                alVar12 = (__m256i)vpsubq_avx2((undefined1  [32])alVar11,auVar47);
                *palVar23 = alVar11;
                *palVar27 = alVar12;
                uVar22 = uVar22 + 1;
                palVar27 = palVar27 + 1;
                palVar23 = palVar23 + 1;
              } while (uVar35 != uVar22);
              *ptr_00 = 0;
              lVar29 = (ulong)(uint)s2Len - 1;
              auVar55._8_8_ = lVar29;
              auVar55._0_8_ = lVar29;
              auVar55._16_8_ = lVar29;
              auVar55._24_8_ = lVar29;
              auVar37._4_4_ = gap;
              auVar37._0_4_ = gap;
              auVar37._8_4_ = gap;
              auVar37._12_4_ = gap;
              auVar44._4_4_ = iVar20;
              auVar44._0_4_ = iVar20;
              auVar44._8_4_ = iVar20;
              auVar44._12_4_ = iVar20;
              auVar49 = vpmovsxbd_avx(ZEXT416(0x4030201));
              uVar22 = 0;
              auVar41 = vpmovsxbq_avx2(ZEXT416(0x3020100));
              auVar54._8_8_ = 0x8000000000000000;
              auVar54._0_8_ = 0x8000000000000000;
              auVar54._16_8_ = 0x8000000000000000;
              auVar54._24_8_ = 0x8000000000000000;
              auVar57 = vpcmpeqd_avx2(auVar57,auVar57);
              auVar38 = vpcmpeqd_avx(auVar38,auVar38);
              auVar59._8_4_ = 4;
              auVar59._0_8_ = 0x400000004;
              auVar59._12_4_ = 4;
              do {
                if (s2_beg == 0) {
                  auVar9 = vpaddd_avx(auVar38,auVar49);
                  auVar9 = vpmulld_avx(auVar9,auVar37);
                  auVar9 = vpsubd_avx(auVar44,auVar9);
                  auVar40 = vpmovsxdq_avx2(auVar9);
                }
                else {
                  auVar40 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                }
                auVar61._8_8_ = uVar22;
                auVar61._0_8_ = uVar22;
                auVar61._16_8_ = uVar22;
                auVar61._24_8_ = uVar22;
                auVar45 = vpor_avx2(auVar61,auVar41);
                auVar45 = vpcmpgtq_avx2(auVar45 ^ auVar54,auVar55 ^ auVar54);
                auVar40 = vpmaskmovq_avx2(auVar45 ^ auVar57,auVar40);
                *(undefined1 (*) [32])(ptr_00 + uVar22 + 1) = auVar40;
                uVar22 = uVar22 + 4;
                auVar49 = vpaddd_avx(auVar59,auVar49);
              } while ((s2Len + 3U & 0xfffffffc) != uVar22);
              alVar11 = (__m256i)vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar47);
              palVar23 = ptr_03 + (a - 1);
              auVar46 = ZEXT3264(auVar51);
              uVar22 = uVar35;
              do {
                *palVar23 = alVar11;
                alVar11 = (__m256i)vpsubq_avx2((undefined1  [32])alVar11,auVar48);
                auVar57 = vpcmpgtq_avx2((undefined1  [32])alVar11,auVar46._0_32_);
                auVar57 = vblendvpd_avx((undefined1  [32])alVar11,auVar46._0_32_,auVar57);
                auVar46 = ZEXT3264(auVar57);
                palVar23 = palVar23 + -1;
                iVar21 = (int)uVar22;
                uVar24 = iVar21 - 1;
                uVar22 = (ulong)uVar24;
              } while (uVar24 != 0 && 0 < iVar21);
              lVar29 = uVar35 * 0x20;
              lVar33 = 0;
              auVar58 = ZEXT3264(CONCAT824(8,CONCAT816(8,CONCAT88(8,8))));
              auVar56._8_8_ = 0x10;
              auVar56._0_8_ = 0x10;
              auVar56._16_8_ = 0x10;
              auVar56._24_8_ = 0x10;
              auVar60._8_8_ = 2;
              auVar60._0_8_ = 2;
              auVar60._16_8_ = 2;
              auVar60._24_8_ = 2;
              auVar62._8_8_ = 4;
              auVar62._0_8_ = 4;
              auVar62._16_8_ = 4;
              auVar62._24_8_ = 4;
              auVar57._8_8_ = uVar25;
              auVar57._0_8_ = uVar25;
              auVar57._16_8_ = uVar25;
              auVar57._24_8_ = uVar25;
              auVar52 = ZEXT3264(auVar57);
              auVar50 = ZEXT3264(auVar57);
              uVar22 = 0;
              iVar21 = iVar1;
              do {
                alVar11 = ptr_02[a - 1];
                auVar38 = alVar11._0_16_;
                auVar42._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar38;
                auVar42._16_16_ = ZEXT116(0) * alVar11._16_16_ + ZEXT116(1) * auVar38;
                auVar57 = vpalignr_avx2((undefined1  [32])alVar11,auVar42,8);
                auVar57 = vpblendd_avx2(auVar57,ZEXT832((ulong)ptr_00[uVar22]),3);
                iVar20 = ppVar5->mapper[(byte)s2[uVar22]];
                auVar8._8_8_ = uVar25;
                auVar8._0_8_ = uVar25;
                auVar8._16_8_ = uVar25;
                auVar8._24_8_ = uVar25;
                auVar41 = vpsubq_avx2(auVar8,(undefined1  [32])*ptr_03);
                lVar32 = 0;
                do {
                  auVar40 = vpaddq_avx2(auVar57,*(undefined1 (*) [32])
                                                 ((long)pvVar4 +
                                                 lVar32 + (long)iVar20 * uVar35 * 0x20));
                  auVar57 = *(undefined1 (*) [32])((long)*ptr_02 + lVar32);
                  auVar53 = vpsubq_avx2(auVar57,auVar47);
                  auVar55 = vpsubq_avx2(*(undefined1 (*) [32])((long)*ptr + lVar32),auVar48);
                  auVar45 = vpcmpgtq_avx2(auVar53,auVar55);
                  auVar54 = vblendvpd_avx(auVar56,auVar58._0_32_,auVar45);
                  auVar41 = vpaddq_avx2(auVar41,*(undefined1 (*) [32])((long)*ptr_03 + lVar32));
                  *(undefined1 (*) [32])
                   ((long)((ppVar19->field_4).rowcols)->score_row + lVar32 + lVar33) = auVar54;
                  auVar54 = vpcmpgtq_avx2(auVar8,auVar41);
                  auVar8 = vblendvpd_avx(auVar41,auVar8,auVar54);
                  auVar58 = ZEXT3264(auVar58._0_32_);
                  auVar54 = vblendvpd_avx(auVar55,auVar53,auVar45);
                  auVar41 = vpcmpgtq_avx2(auVar54,auVar46._0_32_);
                  auVar41 = vblendvpd_avx(auVar54,auVar46._0_32_,auVar41);
                  auVar46 = ZEXT3264(auVar41);
                  auVar41 = vpcmpgtq_avx2(auVar54,auVar40);
                  auVar41 = vblendvpd_avx(auVar40,auVar54,auVar41);
                  *(undefined1 (*) [32])((long)*ptr + lVar32) = auVar54;
                  *(undefined1 (*) [32])((long)*ptr_01 + lVar32) = auVar41;
                  *(undefined1 (*) [32])((long)*ptr_02 + lVar32) = auVar40;
                  lVar32 = lVar32 + 0x20;
                } while (lVar29 != lVar32);
                auVar54 = vpermpd_avx2(auVar41,0x90);
                uVar28 = uVar22 + 1;
                auVar57 = vblendpd_avx(auVar54,ZEXT832((ulong)ptr_00[uVar22 + 1]),1);
                auVar57 = vpaddq_avx2(auVar57,(undefined1  [32])*ptr_03);
                auVar41 = vpcmpgtq_avx2(auVar8,auVar57);
                auVar57 = vblendvpd_avx(auVar57,auVar8,auVar41);
                bVar36 = true;
                do {
                  bVar30 = bVar36;
                  auVar41 = vperm2f128_avx(auVar57,auVar57,8);
                  auVar41 = vpalignr_avx2(auVar57,auVar41,8);
                  auVar41 = vpaddq_avx2(auVar39,auVar41);
                  auVar40 = vpcmpgtq_avx2(auVar57,auVar41);
                  auVar57 = vblendvpd_avx(auVar41,auVar57,auVar40);
                  bVar36 = false;
                } while (bVar30);
                auVar41 = vperm2f128_avx(auVar57,auVar57,8);
                auVar57 = vpalignr_avx2(auVar57,auVar41,8);
                auVar41 = vpaddq_avx2(auVar57,ZEXT832(uVar25));
                auVar57 = vblendpd_avx(auVar54,ZEXT832((ulong)ptr_00[uVar22 + 1]),1);
                auVar54 = vpcmpgtq_avx2(auVar41,auVar57);
                auVar57 = vblendvpd_avx(auVar57,auVar41,auVar54);
                lVar32 = 0;
                auVar14._8_8_ = 0x20;
                auVar14._0_8_ = 0x20;
                auVar14._16_8_ = 0x20;
                auVar14._24_8_ = 0x20;
                auVar15._8_8_ = 0x40;
                auVar15._0_8_ = 0x40;
                auVar15._16_8_ = 0x40;
                auVar15._24_8_ = 0x40;
                do {
                  auVar40 = vpsubq_avx2(auVar57,auVar47);
                  auVar41 = vpsubq_avx2(auVar41,auVar48);
                  auVar57 = vpcmpgtq_avx2(auVar40,auVar41);
                  auVar54 = vblendvpd_avx(auVar15,auVar14,auVar57);
                  auVar41 = vblendvpd_avx(auVar41,auVar40,auVar57);
                  auVar57 = *(undefined1 (*) [32])((long)*ptr_01 + lVar32);
                  auVar40 = vpcmpgtq_avx2(auVar57,auVar41);
                  auVar57 = vblendvpd_avx(auVar41,auVar57,auVar40);
                  pauVar2 = (undefined1 (*) [24])((long)*ptr_02 + lVar32);
                  auVar43._0_8_ = -(ulong)(auVar57._0_8_ == *(long *)*pauVar2);
                  auVar43._8_8_ = -(ulong)(auVar57._8_8_ == *(long *)(*pauVar2 + 8));
                  auVar43._16_8_ = -(ulong)(auVar57._16_8_ == SUB248(*pauVar2,0x10));
                  auVar43._24_8_ = -(ulong)(auVar57._24_8_ == *(long *)pauVar2[1]);
                  piVar6 = ((ppVar19->field_4).rowcols)->score_row;
                  auVar40 = vpaddq_avx2(auVar40,auVar60);
                  auVar40 = vblendvpd_avx(auVar40,auVar62,auVar43);
                  auVar54 = vorpd_avx(auVar54,*(undefined1 (*) [32])((long)piVar6 + lVar32 + lVar33)
                                     );
                  auVar54 = vorpd_avx(auVar54,auVar40);
                  *(undefined1 (*) [32])((long)piVar6 + lVar32 + lVar33) = auVar54;
                  *(undefined1 (*) [32])((long)*ptr_02 + lVar32) = auVar57;
                  auVar54 = vpcmpgtq_avx2(auVar57,auVar46._0_32_);
                  auVar54 = vblendvpd_avx(auVar57,auVar46._0_32_,auVar54);
                  auVar40 = vpcmpgtq_avx2(auVar41,auVar54);
                  auVar54 = vblendvpd_avx(auVar41,auVar54,auVar40);
                  auVar46 = ZEXT3264(auVar54);
                  auVar40 = vpcmpgtq_avx2(auVar52._0_32_,auVar57);
                  auVar40 = vblendvpd_avx(auVar57,auVar52._0_32_,auVar40);
                  auVar52 = ZEXT3264(auVar40);
                  lVar32 = lVar32 + 0x20;
                } while (lVar29 != lVar32);
                auVar41 = vpcmpgtq_avx2((undefined1  [32])ptr_02[uVar7],auVar50._0_32_);
                auVar57 = vblendvpd_avx(auVar50._0_32_,(undefined1  [32])ptr_02[uVar7],auVar41);
                auVar38 = auVar57._16_16_;
                auVar50 = ZEXT3264(auVar57);
                auVar10._8_8_ = -(ulong)(iVar26 == 2);
                auVar10._0_8_ = -(ulong)(iVar26 == 3);
                auVar10._16_8_ = -(ulong)(iVar26 == 1);
                auVar10._24_8_ = -(ulong)(-iVar18 == -3);
                auVar10 = auVar10 & auVar41;
                if ((((auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar10 >> 0x7f,0) != '\0') || SUB321(auVar10 >> 0xbf,0) != '\0') ||
                    auVar10[0x1f] < '\0') {
                  iVar21 = (int)uVar22;
                }
                lVar33 = lVar33 + lVar29;
                uVar22 = uVar28;
              } while (uVar28 != (uint)s2Len);
              uVar35 = uVar25;
              if (s2_end != 0) {
                if (iVar18 < 3) {
                  iVar20 = 0;
                  do {
                    auVar39 = auVar50._0_32_;
                    auVar57 = vperm2i128_avx2(auVar39,auVar39,8);
                    auVar57 = vpalignr_avx2(auVar39,auVar57,8);
                    auVar38 = auVar57._16_16_;
                    auVar50 = ZEXT3264(auVar57);
                    iVar20 = iVar20 + 1;
                  } while (iVar20 < iVar26);
                }
                uVar35 = vpextrq_avx(auVar38,1);
              }
              uVar24 = uVar17;
              if ((s1_end != 0) && (((ulong)uVar3 + 3 & 0x7ffffffc) != 0)) {
                uVar28 = 0;
                uVar22 = uVar35;
                do {
                  uVar31 = ((uint)uVar28 & 3) * a + ((uint)(uVar28 >> 2) & 0x3fffffff);
                  uVar35 = uVar22;
                  iVar20 = iVar21;
                  uVar16 = uVar24;
                  if (((int)uVar31 < (int)uVar3) &&
                     (uVar35 = (*ptr_02)[uVar28], iVar20 = iVar1, uVar16 = uVar31,
                     (long)uVar35 <= (long)uVar22)) {
                    if ((int)uVar24 <= (int)uVar31) {
                      uVar31 = uVar24;
                    }
                    if (iVar21 != iVar1) {
                      uVar31 = uVar24;
                    }
                    bVar36 = uVar35 == uVar22;
                    uVar35 = uVar22;
                    iVar20 = iVar21;
                    uVar16 = uVar24;
                    if (bVar36) {
                      uVar16 = uVar31;
                    }
                  }
                  uVar24 = uVar16;
                  iVar21 = iVar20;
                  uVar28 = uVar28 + 1;
                  uVar22 = uVar35;
                } while ((a & 0x1fffffff) << 2 != (int)uVar28);
              }
              iVar20 = (int)uVar35;
              if (s2_end == 0 && s1_end == 0) {
                alVar11 = ptr_02[uVar7];
                auVar38 = alVar11._16_16_;
                if (iVar18 < 3) {
                  iVar21 = 0;
                  do {
                    auVar57 = vperm2i128_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar11,8)
                    ;
                    alVar11 = (__m256i)vpalignr_avx2((undefined1  [32])alVar11,auVar57,8);
                    auVar38 = alVar11._16_16_;
                    iVar21 = iVar21 + 1;
                  } while (iVar21 < iVar26);
                }
                uVar34 = vpextrq_avx(auVar38,1);
                iVar20 = (int)uVar34;
                iVar21 = iVar1;
                uVar24 = uVar17;
              }
              auVar13._8_8_ = uVar25;
              auVar13._0_8_ = uVar25;
              auVar13._16_8_ = uVar25;
              auVar13._24_8_ = uVar25;
              auVar57 = vpcmpgtq_avx2(auVar13,auVar54);
              auVar39 = vpcmpgtq_avx2(auVar40,auVar51);
              auVar57 = vpor_avx2(auVar57,auVar39);
              if ((((auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   SUB321(auVar57 >> 0x7f,0) != '\0') || SUB321(auVar57 >> 0xbf,0) != '\0') ||
                  auVar57[0x1f] < '\0') {
                *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
                iVar20 = 0;
                iVar21 = 0;
                uVar24 = 0;
              }
              ppVar19->score = iVar20;
              ppVar19->end_query = uVar24;
              ppVar19->end_ref = iVar21;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar19;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;
    __m256i vTIns;
    __m256i vTDel;
    __m256i vTDiag;
    __m256i vTDiagE;
    __m256i vTInsE;
    __m256i vTDiagF;
    __m256i vTDelF;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));
    vTIns  = _mm256_set1_epi64x_rpl(PARASAIL_INS);
    vTDel  = _mm256_set1_epi64x_rpl(PARASAIL_DEL);
    vTDiag = _mm256_set1_epi64x_rpl(PARASAIL_DIAG);
    vTDiagE= _mm256_set1_epi64x_rpl(PARASAIL_DIAG_E);
    vTInsE = _mm256_set1_epi64x_rpl(PARASAIL_INS_E);
    vTDiagF= _mm256_set1_epi64x_rpl(PARASAIL_DIAG_F);
    vTDelF = _mm256_set1_epi64x_rpl(PARASAIL_DEL_F);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 32, sizeof(__m256i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vHt;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vT;
        __m256i vET;
        __m256i vFT;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vE_opn = _mm256_sub_epi64(vH, vGapO);
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            case1 = _mm256_cmpgt_epi64(vE_opn, vE_ext);
            vET = _mm256_blendv_epi8(vTInsE, vTDiagE, case1);
            arr_store(result->trace->trace_table, vET, i, segLen, j);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vE);
            vGapper = _mm256_add_epi64(vHt, vGapper);
            vF = _mm256_max_epi64_rpl(vF, vGapper);
            vHp = _mm256_add_epi64(vHp, vW);
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            _mm256_store_si256(pvH+i, vHp);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapper = _mm256_add_epi64(vHt, vGapper);
        vF = _mm256_max_epi64_rpl(vF, vGapper);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            vF = _mm256_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        vH = _mm256_max_epi64_rpl(vF, vHt);
        for (i=0; i<segLen; ++i) {
            vET = arr_load(result->trace->trace_table, i, segLen, j);
            vHp = _mm256_load_si256(pvH+i);
            vHt = _mm256_load_si256(pvHt+i);
            vF_opn = _mm256_sub_epi64(vH, vGapO);
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vF_opn, vF_ext);
            vFT = _mm256_blendv_epi8(vTDelF, vTDiagF, case1);
            vH = _mm256_max_epi64_rpl(vHt, vF);
            case1 = _mm256_cmpeq_epi64(vH, vHp);
            case2 = _mm256_cmpeq_epi64(vH, vF);
            vT = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vTIns, vTDel, case2),
                    vTDiag, case1);
            vT = _mm256_or_si256(vT, vET);
            vT = _mm256_or_si256(vT, vFT);
            arr_store(result->trace->trace_table, vT, i, segLen, j);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
        }

        /* extract vector containing last value from column */
        {
            __m256i vCompare;
            vH = _mm256_load_si256(pvH + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi64(vH, vMaxH));
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
        }
    } 

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}